

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

TypedExpectation<int_(int,_int,_int)> * __thiscall
testing::internal::MockSpec<int_(int,_int,_int)>::InternalExpectedAt
          (MockSpec<int_(int,_int,_int)> *this,char *file,int line,char *obj,char *call)

{
  TypedExpectation<int_(int,_int,_int)> *pTVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  allocator local_d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [8];
  string source_text;
  char *call_local;
  char *obj_local;
  int line_local;
  char *file_local;
  MockSpec<int_(int,_int,_int)> *this_local;
  
  source_text.field_2._8_8_ = call;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d0,"EXPECT_CALL(",&local_d1);
  std::operator+(&local_b0,&local_d0,obj);
  std::operator+(&local_90,&local_b0,", ");
  std::operator+(&local_70,&local_90,(char *)source_text.field_2._8_8_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                 &local_70,")");
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  std::operator+(&local_108,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                 " invoked");
  LogWithLocation(kInfo,file,line,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  pTVar1 = FunctionMockerBase<int_(int,_int,_int)>::AddNewExpectation
                     (this->function_mocker_,file,line,(string *)local_50,&this->matchers_);
  std::__cxx11::string::~string((string *)local_50);
  return pTVar1;
}

Assistant:

internal::TypedExpectation<F>& InternalExpectedAt(
      const char* file, int line, const char* obj, const char* call) {
    const std::string source_text(std::string("EXPECT_CALL(") + obj + ", " +
                                  call + ")");
    LogWithLocation(internal::kInfo, file, line, source_text + " invoked");
    return function_mocker_->AddNewExpectation(
        file, line, source_text, matchers_);
  }